

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  code *pcVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  Chunk *pCVar6;
  void *pvVar7;
  undefined8 *puVar8;
  CleanupNode *pCVar9;
  CleanupNode *pCVar10;
  ulong size;
  size_t sVar11;
  code *pcVar12;
  undefined8 *puVar13;
  code *pcVar14;
  code *pcVar15;
  _func_void_void_ptr *p_Var16;
  bool bVar17;
  SizedPtr SVar18;
  
  pCVar10 = this->next_;
  pCVar9 = this->limit_;
  if (pCVar10 != pCVar9) {
    AddFallback();
    if ((undefined8 *)pCVar10->elem == (undefined8 *)0x0) {
      return;
    }
    uVar4 = *(ulong *)((long)pCVar9[6].elem + 8) & 0xfffffffffffffff8;
    if (uVar4 == 0) {
      pcVar14 = (code *)0x0;
    }
    else {
      pcVar14 = *(code **)(uVar4 + 0x18);
    }
    p_Var16 = pCVar10->destructor;
    puVar8 = (undefined8 *)pCVar10->elem;
    do {
      pcVar15 = p_Var16 + -0x10;
      pcVar1 = (code *)(puVar8 + 2);
      pcVar12 = pcVar15;
      if (pcVar1 <= pcVar15) {
        uVar3 = 0;
        do {
          pcVar12 = pcVar12 + -0x10;
          if (pcVar12 < pcVar1) break;
          bVar17 = uVar3 < 7;
          uVar3 = uVar3 + 1;
        } while (bVar17);
      }
      for (; pcVar1 <= pcVar12; pcVar12 = pcVar12 + -0x10) {
        (**(code **)(pcVar15 + 8))(*(undefined8 *)pcVar15);
        pcVar15 = pcVar15 + -0x10;
      }
      puVar13 = (undefined8 *)*puVar8;
      if (pcVar1 <= pcVar15) {
        do {
          (**(code **)(pcVar15 + 8))(*(undefined8 *)pcVar15);
          pcVar15 = pcVar15 + -0x10;
        } while (pcVar1 <= pcVar15);
        puVar13 = (undefined8 *)*puVar8;
      }
      if (pcVar14 == (code *)0x0) {
        operator_delete(puVar8,puVar8[1]);
      }
      else {
        (*pcVar14)();
      }
      if (puVar13 == (undefined8 *)0x0) {
        return;
      }
      p_Var16 = (_func_void_void_ptr *)
                ((long)puVar13 + (puVar13[1] - 0x10 & 0xfffffffffffffff0) + 0x10);
      puVar8 = puVar13;
    } while( true );
  }
  uVar4 = (arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (this->head_ != (Chunk *)0x0) {
    sVar11 = this->head_->size;
    uVar2 = sVar11 * 2;
    size = 0x1000;
    if (uVar2 < 0x1000) {
      size = uVar2;
    }
    if (sVar11 != 0) goto LAB_001c8fea;
  }
  size = 0x40;
LAB_001c8fea:
  if (uVar4 == 0) {
    lVar5 = __tls_get_addr(&PTR_004be5e8);
    if (*(code **)(lVar5 + 0x28) == (code *)0x0) {
      pvVar7 = operator_new(size);
      SVar18.n = size;
      SVar18.p = pvVar7;
    }
    else {
      SVar18 = (SizedPtr)(**(code **)(lVar5 + 0x28))(size,*(undefined8 *)(lVar5 + 0x30));
    }
  }
  else {
    SVar18 = anon_unknown_12::AllocateMemory(*(AllocationPolicy **)(uVar4 + 0x10),size);
  }
  sVar11 = SVar18.n;
  pCVar6 = (Chunk *)SVar18.p;
  (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i + sVar11;
  pCVar6->next = this->head_;
  pCVar6->size = sVar11;
  this->head_ = pCVar6;
  this->prefetch_ptr_ = (char *)(pCVar6 + 1);
  this->limit_ = (CleanupNode *)((long)&pCVar6[1].next + (sVar11 - 0x10 & 0xfffffffffffffff0));
  this->next_ = (CleanupNode *)(pCVar6 + 2);
  pCVar6[1].next = (Chunk *)elem;
  pCVar6[1].size = (size_t)destructor;
  return;
}

Assistant:

void ChunkList::AddFallback(void* elem, void (*destructor)(void*),
                            SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}